

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

uint32 scanner_block_hash_fn(ScannerBlock *b,hash_fns_t *fns)

{
  int local_3c;
  ScanState **sb;
  intptr_t block_size;
  intptr_t i;
  uint32 hash;
  hash_fns_t *fns_local;
  ScannerBlock *b_local;
  
  i._4_4_ = 0;
  for (block_size = 0; block_size < (long)fns->data[0]; block_size = block_size + 1) {
    if (b->chars[block_size] == (ScanState *)0x0) {
      local_3c = 1;
    }
    else {
      local_3c = b->chars[block_size]->index + 2;
    }
    i._4_4_ = local_3c + i._4_4_ * 0x11;
  }
  return i._4_4_;
}

Assistant:

static uint32 scanner_block_hash_fn(ScannerBlock *b, hash_fns_t *fns) {
  uint32 hash = 0;
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    hash *= 17;
    hash += sb[i] ? sb[i]->index + 2 : 1;
  }
  return hash;
}